

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::eliminate_dropout(NetOptimize *this)

{
  int iVar1;
  pointer ppLVar2;
  pointer ppLVar3;
  Layer *pLVar4;
  pointer ppLVar5;
  Layer *pLVar6;
  int *piVar7;
  bool bVar8;
  long lVar9;
  int i;
  long lVar10;
  long lVar11;
  long local_48;
  long local_40;
  
  ppLVar2 = (this->super_Net).layers.
            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppLVar3 = (this->super_Net).layers.
            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_40 = -1;
  local_48 = -0x100000000;
  lVar10 = 0;
  do {
    if (lVar10 == (long)ppLVar2 - (long)ppLVar3 >> 3) {
      return 0;
    }
    bVar8 = std::operator!=(&(this->super_Net).layers.
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar10]->type,"Dropout");
    if (!bVar8) {
      pLVar4 = (this->super_Net).layers.
               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10];
      if ((*(float *)&pLVar4[1]._vptr_Layer == 1.0) && (!NAN(*(float *)&pLVar4[1]._vptr_Layer))) {
        iVar1 = *(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar9 = local_48;
        for (lVar11 = local_40; lVar11 != -1 && -1 < lVar11 + 1; lVar11 = lVar11 + -1) {
          bVar8 = std::operator==(&(this->super_Net).layers.
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar11]->type,
                                  "ncnnfused");
          if (!bVar8) {
            ppLVar5 = (this->super_Net).layers.
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar6 = ppLVar5[lVar11];
            piVar7 = (pLVar6->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (((long)*(pointer *)
                        ((long)&(pLVar6->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl
                        + 8) - (long)piVar7 == 4) && (*piVar7 == iVar1)) {
              lVar9 = *(long *)((long)ppLVar5 + (lVar9 >> 0x1d));
              fprintf(_stderr,"eliminate_dropout %s %s\n",*(undefined8 *)(lVar9 + 0x38),
                      (pLVar4->name)._M_dataplus._M_p);
              iVar1 = *(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              **(int **)(lVar9 + 0x70) = iVar1;
              (this->super_Net).blobs.super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
              _M_impl.super__Vector_impl_data._M_start[iVar1].producer = (int)lVar11;
              std::__cxx11::string::assign((char *)&pLVar4->type);
              break;
            }
          }
          lVar9 = lVar9 + -0x100000000;
        }
      }
    }
    lVar10 = lVar10 + 1;
    local_40 = local_40 + 1;
    local_48 = local_48 + 0x100000000;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_dropout()
{
    const size_t layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "Dropout")
            continue;

        ncnn::Dropout* dropout = (ncnn::Dropout*)layers[i];
        if (dropout->scale != 1.f)
            continue;

        // Any - Dropout
        int bottom_blob_index = layers[i]->bottoms[0];

        int j = i - 1;
        for (; j>=0; j--)
        {
            if (layers[j]->type == "ncnnfused")
                continue;

            if (layers[j]->tops.size() != 1)
                continue;

            if (layers[j]->tops[0] == bottom_blob_index)
                break;
        }

        if (j == -1)
            continue;

        ncnn::Layer* any = layers[j];

        fprintf(stderr, "eliminate_dropout %s %s\n", any->name.c_str(), dropout->name.c_str());

        int top_blob_index_final = dropout->tops[0];
        any->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = j;
        dropout->type = "ncnnfused";
    }

    return 0;
}